

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowTreatmentDeviceType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcFlowTreatmentDeviceType *in;
  
  in = (IfcFlowTreatmentDeviceType *)operator_new(0x1c8);
  *(undefined ***)&(in->super_IfcDistributionFlowElementType).field_0x1b0 = &PTR__Object_007e4a70;
  *(undefined8 *)&in->field_0x1b8 = 0;
  *(char **)&in->field_0x1c0 = "IfcFlowTreatmentDeviceType";
  Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::IfcDistributionFlowElementType
            ((IfcDistributionFlowElementType *)in,&PTR_construction_vtable_24__0084b848);
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.super_IfcTypeObject = &PTR__IfcFlowTreatmentDeviceType_0084b6f0;
  *(undefined ***)&(in->super_IfcDistributionFlowElementType).field_0x1b0 =
       &PTR__IfcFlowTreatmentDeviceType_0084b830;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = &PTR__IfcFlowTreatmentDeviceType_0084b718
  ;
  (in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType.
  super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFlowTreatmentDeviceType_0084b740;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = &PTR__IfcFlowTreatmentDeviceType_0084b768
  ;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .super_IfcTypeProduct.field_0x148 = &PTR__IfcFlowTreatmentDeviceType_0084b790;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .field_0x180 = &PTR__IfcFlowTreatmentDeviceType_0084b7b8;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
    .field_0x190 = &PTR__IfcFlowTreatmentDeviceType_0084b7e0;
  *(undefined ***)
   &(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.field_0x1a0 =
       &PTR__IfcFlowTreatmentDeviceType_0084b808;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFlowTreatmentDeviceType>(db,params,in);
  return (Object *)
         (&(in->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcDistributionFlowElementType).
                             super_IfcDistributionElementType.super_IfcElementType.
                             super_IfcTypeProduct.super_IfcTypeObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }